

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O3

idx_t __thiscall duckdb::ARTKey::GetMismatchPos(ARTKey *this,ARTKey *other,idx_t start)

{
  if (start < other->len) {
    do {
      if (this->data[start] != other->data[start]) {
        return start;
      }
      start = start + 1;
    } while (other->len != start);
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t ARTKey::GetMismatchPos(const ARTKey &other, const idx_t start) const {
	D_ASSERT(len <= other.len);
	D_ASSERT(start <= len);
	for (idx_t i = start; i < other.len; i++) {
		if (data[i] != other.data[i]) {
			return i;
		}
	}
	return DConstants::INVALID_INDEX;
}